

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

SampleInfo * __thiscall
BasicContainer::sampleSurface
          (SampleInfo *__return_storage_ptr__,BasicContainer *this,Sampler *sampler)

{
  uint uVar1;
  size_type sVar2;
  const_reference ppBVar3;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *this_00;
  SampleInfo *info;
  float local_20;
  uint id;
  Sampler *sampler_local;
  BasicContainer *this_local;
  
  this_00 = &this->list;
  sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(this_00);
  uVar1 = (*sampler->_vptr_Sampler[2])(sampler,sVar2 & 0xffffffff);
  ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                      (this_00,(ulong)uVar1);
  (*((*ppBVar3)->super_Primitive)._vptr_Primitive[2])(__return_storage_ptr__,*ppBVar3,sampler);
  sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(this_00);
  local_20 = (float)sVar2;
  __return_storage_ptr__->pdf = __return_storage_ptr__->pdf / local_20;
  return __return_storage_ptr__;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const override
	{
		unsigned id = sampler.get1u(list.size());
		SampleInfo info = list[id]->sampleSurface(sampler);
		info.pdf /= list.size();
		return info;
	}